

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

cram_file_def * cram_read_file_def(cram_fd *fd)

{
  cram_file_def *buffer;
  ssize_t sVar1;
  
  buffer = (cram_file_def *)malloc(0x1a);
  if (buffer != (cram_file_def *)0x0) {
    sVar1 = hread(fd->fp,buffer,0x1a);
    if ((sVar1 == 0x1a) && (*(int *)buffer->magic == 0x4d415243)) {
      if (buffer->major_version < 4) {
        fd->first_container = fd->first_container + 0x1a;
        fd->last_slice = 0;
        return buffer;
      }
      fprintf(_stderr,"CRAM version number mismatch\nExpected 1.x, 2.x or 3.x, got %d.%d\n",
              (ulong)buffer->major_version,(ulong)buffer->minor_version);
    }
    free(buffer);
  }
  return (cram_file_def *)0x0;
}

Assistant:

cram_file_def *cram_read_file_def(cram_fd *fd) {
    cram_file_def *def = malloc(sizeof(*def));
    if (!def)
	return NULL;

    if (26 != hread(fd->fp, &def->magic[0], 26)) {
	free(def);
	return NULL;
    }

    if (memcmp(def->magic, "CRAM", 4) != 0) {
	free(def);
	return NULL;
    }

    if (def->major_version > 3) {
	fprintf(stderr, "CRAM version number mismatch\n"
		"Expected 1.x, 2.x or 3.x, got %d.%d\n",
		def->major_version, def->minor_version);
	free(def);
	return NULL;
    }

    fd->first_container += 26;
    fd->last_slice = 0;

    return def;
}